

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

RandSequenceStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::RandSequenceStatement,slang::ast::RandSeqProductionSymbol_const*&,slang::SourceRange>
          (BumpAllocator *this,RandSeqProductionSymbol **args,SourceRange *args_1)

{
  RandSeqProductionSymbol *pRVar1;
  SourceLocation SVar2;
  SourceLocation SVar3;
  RandSequenceStatement *pRVar4;
  
  pRVar4 = (RandSequenceStatement *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((RandSequenceStatement *)this->endPtr < pRVar4 + 1) {
    pRVar4 = (RandSequenceStatement *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pRVar4 + 1);
  }
  pRVar1 = *args;
  SVar2 = args_1->startLoc;
  SVar3 = args_1->endLoc;
  (pRVar4->super_Statement).kind = RandSequence;
  (pRVar4->super_Statement).syntax = (StatementSyntax *)0x0;
  (pRVar4->super_Statement).sourceRange.startLoc = SVar2;
  (pRVar4->super_Statement).sourceRange.endLoc = SVar3;
  pRVar4->firstProduction = pRVar1;
  return pRVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }